

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

bool __thiscall ExecutorX86::RemoveBreakpoint(ExecutorX86 *this,uint instruction)

{
  uchar uVar1;
  uint uVar2;
  Breakpoint *pBVar3;
  uchar **ppuVar4;
  uint local_24;
  uint local_20;
  uint i;
  uint index;
  uint instruction_local;
  ExecutorX86 *this_local;
  
  uVar2 = FastVector<unsigned_char_*,_false,_false>::size(&this->instAddress);
  if (uVar2 < instruction) {
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"ERROR: break position out of code range");
    this->execErrorMessage = this->execErrorBuffer;
  }
  else {
    local_20 = 0xffffffff;
    for (local_24 = 0;
        uVar2 = FastVector<ExecutorX86::Breakpoint,_false,_false>::size(&this->breakInstructions),
        local_24 < uVar2 && local_20 == 0xffffffff; local_24 = local_24 + 1) {
      pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                         (&this->breakInstructions,local_24);
      if (pBVar3->instIndex == instruction) {
        local_20 = local_24;
      }
    }
    if (local_20 != 0xffffffff) {
      pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                         (&this->breakInstructions,local_20);
      ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                          (&this->instAddress,pBVar3->instIndex);
      if (**ppuVar4 == 0xcc) {
        pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                           (&this->breakInstructions,local_20);
        uVar1 = pBVar3->oldOpcode;
        pBVar3 = FastVector<ExecutorX86::Breakpoint,_false,_false>::operator[]
                           (&this->breakInstructions,local_20);
        ppuVar4 = FastVector<unsigned_char_*,_false,_false>::operator[]
                            (&this->instAddress,pBVar3->instIndex);
        **ppuVar4 = uVar1;
        return true;
      }
    }
    NULLC::SafeSprintf(this->execErrorBuffer,0x10000,
                       "ERROR: there is no breakpoint at instruction %d",(ulong)instruction);
    this->execErrorMessage = this->execErrorBuffer;
  }
  return false;
}

Assistant:

bool ExecutorX86::RemoveBreakpoint(unsigned int instruction)
{
	if(instruction > instAddress.size())
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: break position out of code range");
		execErrorMessage = execErrorBuffer;
		return false;
	}

	unsigned index = ~0u;
	for(unsigned i = 0; i < breakInstructions.size() && index == ~0u; i++)
	{
		if(breakInstructions[i].instIndex == instruction)
			index = i;
	}

	if(index == ~0u || *instAddress[breakInstructions[index].instIndex] != 0xcc)
	{
		NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "ERROR: there is no breakpoint at instruction %d", instruction);
		execErrorMessage = execErrorBuffer;
		return false;
	}

	*instAddress[breakInstructions[index].instIndex] = breakInstructions[index].oldOpcode;
	return true;
}